

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxFacts.cpp
# Opt level: O2

SyntaxKind slang::syntax::SyntaxFacts::getKeywordNameExpression(TokenKind kind)

{
  SyntaxKind SVar1;
  undefined2 in_register_0000003a;
  int iVar2;
  
  iVar2 = CONCAT22(in_register_0000003a,kind);
  if (iVar2 == 99) {
    SVar1 = ArrayAndMethod;
  }
  else {
    if (iVar2 == 0xd1) {
      return LocalScope;
    }
    if (iVar2 == 0xdd) {
      SVar1 = ConstructorName;
    }
    else if (iVar2 == 0xe6) {
      SVar1 = ArrayOrMethod;
    }
    else {
      if (iVar2 == 0x122) {
        return SuperHandle;
      }
      if (iVar2 == 0x12a) {
        return ThisHandle;
      }
      if (iVar2 == 0x13b) {
        SVar1 = ArrayUniqueMethod;
      }
      else {
        if (iVar2 != 0x154) {
          if (iVar2 == 0x155) {
            return UnitScope;
          }
          if (iVar2 == 0x156) {
            return RootScope;
          }
          return Unknown;
        }
        SVar1 = ArrayXorMethod;
      }
    }
  }
  return SVar1;
}

Assistant:

SyntaxKind SyntaxFacts::getKeywordNameExpression(TokenKind kind) {
    switch (kind) {
        case TokenKind::UnitSystemName: return SyntaxKind::UnitScope;
        case TokenKind::RootSystemName: return SyntaxKind::RootScope;
        case TokenKind::LocalKeyword: return SyntaxKind::LocalScope;
        case TokenKind::ThisKeyword: return SyntaxKind::ThisHandle;
        case TokenKind::SuperKeyword: return SyntaxKind::SuperHandle;
        case TokenKind::UniqueKeyword: return SyntaxKind::ArrayUniqueMethod;
        case TokenKind::AndKeyword: return SyntaxKind::ArrayAndMethod;
        case TokenKind::OrKeyword: return SyntaxKind::ArrayOrMethod;
        case TokenKind::XorKeyword: return SyntaxKind::ArrayXorMethod;
        case TokenKind::NewKeyword: return SyntaxKind::ConstructorName;
        default: return SyntaxKind::Unknown;
    }
}